

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::drawArraysIndirect(ReferenceContext *this,deUint32 mode,void *indirect)

{
  bool bVar1;
  deBool dVar2;
  int iVar3;
  deUint8 *pdVar4;
  uint *puVar5;
  DrawArraysIndirectCommand *command;
  void *indirect_local;
  deUint32 mode_local;
  ReferenceContext *this_local;
  
  bVar1 = predrawErrorChecks(this,mode);
  if (bVar1) {
    do {
      if (this->m_drawIndirectBufferBinding == (DataBuffer *)0x0) {
        setError(this,0x502);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      dVar2 = deIsAlignedPtr(indirect,4);
      if (dVar2 == 0) {
        setError(this,0x502);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      iVar3 = rc::DataBuffer::getSize(this->m_drawIndirectBufferBinding);
      if ((void *)(long)iVar3 < indirect) {
        setError(this,0x502);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    do {
      iVar3 = rc::DataBuffer::getSize(this->m_drawIndirectBufferBinding);
      if ((ulong)(long)iVar3 < (long)indirect + 0x10U) {
        setError(this,0x502);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    pdVar4 = rc::DataBuffer::getData(this->m_drawIndirectBufferBinding);
    puVar5 = (uint *)(pdVar4 + (long)indirect);
    do {
      if (puVar5[3] != 0) {
        setError(this,0x502);
        return;
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    (*(this->super_Context)._vptr_Context[0x69])
              (this,(ulong)mode,(ulong)puVar5[2],(ulong)*puVar5,(ulong)puVar5[1]);
  }
  return;
}

Assistant:

void ReferenceContext::drawArraysIndirect (deUint32 mode, const void *indirect)
{
	struct DrawArraysIndirectCommand
	{
		deUint32 count;
		deUint32 primCount;
		deUint32 first;
		deUint32 reservedMustBeZero;
	};

	const DrawArraysIndirectCommand* command;

	// Check errors

	if (!predrawErrorChecks(mode))
		return;

	// Check pointer validity

	RC_IF_ERROR(m_drawIndirectBufferBinding == DE_NULL, GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR(!deIsAlignedPtr(indirect, 4), GL_INVALID_OPERATION, RC_RET_VOID);

	// \note watch for overflows, indirect might be close to 0xFFFFFFFF and indirect+something might overflow
	RC_IF_ERROR((size_t)((const char*)indirect - (const char*)DE_NULL)                                     > (size_t)m_drawIndirectBufferBinding->getSize(), GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR((size_t)((const char*)indirect - (const char*)DE_NULL) + sizeof(DrawArraysIndirectCommand) > (size_t)m_drawIndirectBufferBinding->getSize(), GL_INVALID_OPERATION, RC_RET_VOID);

	// Check values

	command = (const DrawArraysIndirectCommand*)(m_drawIndirectBufferBinding->getData() + ((const char*)indirect - (const char*)DE_NULL));
	RC_IF_ERROR(command->reservedMustBeZero != 0, GL_INVALID_OPERATION, RC_RET_VOID);

	// draw
	drawArraysInstanced(mode, command->first, command->count, command->primCount);
}